

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setDateTime(QDateTimeEdit *this,QDateTime *datetime)

{
  QAbstractSpinBoxPrivate *this_00;
  char cVar1;
  QDate min;
  long in_FS_OFFSET;
  QDateTime when;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  cVar1 = QDateTime::isValid();
  if (cVar1 != '\0') {
    _when = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime::toTimeZone((QTimeZone *)&when);
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xf8))(this_00);
    min.jd = QDateTime::date();
    if (((ulong)this_00[1].super_QWidgetPrivate.layout & 0x700) == 0) {
      setDateRange(this,min,min);
    }
    ::QVariant::QVariant(&local_48,&when);
    QAbstractSpinBoxPrivate::setValue(this_00,&local_48,EmitIfChanged,true);
    ::QVariant::~QVariant(&local_48);
    QDateTime::~QDateTime(&when);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDateTime(const QDateTime &datetime)
{
    Q_D(QDateTimeEdit);
    if (datetime.isValid()) {
        QDateTime when = d->convertTimeZone(datetime);
        Q_ASSERT(when.timeRepresentation() == d->timeZone);

        d->clearCache();
        const QDate date = when.date();
        if (!(d->sections & DateSections_Mask))
            setDateRange(date, date);
        d->setValue(when, EmitIfChanged);
    }
}